

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<char*&,char*&,char*&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,char **args,char **args_1,
          char **args_2)

{
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  v8 *in_R8;
  char **in_R9;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000010;
  log_msg *in_stack_00000018;
  char **in_stack_00000020;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  logger *in_stack_fffffffffffffb88;
  logger *in_stack_fffffffffffffb90;
  level_enum in_stack_fffffffffffffbec;
  log_msg *in_stack_fffffffffffffbf0;
  string_view_t in_stack_fffffffffffffbf8;
  string_view_t in_stack_fffffffffffffc08;
  source_loc in_stack_fffffffffffffc20;
  basic_string_view<char> local_388 [2];
  buffer<char> *in_stack_fffffffffffffc98;
  locale_ref in_stack_fffffffffffffca0;
  unsigned_long_long in_stack_fffffffffffffca8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_stack_fffffffffffffcb0;
  basic_string_view<char> in_stack_fffffffffffffcb8;
  locale_ref local_2f0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*,_char_*,_char_*>
  local_2e8;
  undefined8 local_2b8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*,_char_*,_char_*>
  *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  allocator<char> local_281;
  buffer<char> local_280 [9];
  undefined1 local_15a;
  byte local_159;
  char **local_158;
  v8 *local_150;
  undefined8 local_138;
  undefined8 uStack_130;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*,_char_*,_char_*>
  *local_30;
  undefined8 *local_28;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*,_char_*,_char_*>
  *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*,_char_*,_char_*>
  *local_8;
  
  local_158 = in_R9;
  local_150 = in_R8;
  local_138 = in_RDX;
  uStack_130 = in_RCX;
  local_159 = should_log(in_stack_fffffffffffffb88,
                         (level_enum)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  local_15a = details::backtracer::enabled((backtracer *)0x1829bb);
  if (((local_159 & 1) != 0) || ((bool)local_15a)) {
    std::allocator<char>::allocator();
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffb80,(allocator<char> *)in_stack_fffffffffffffb78);
    std::allocator<char>::~allocator(&local_281);
    local_2a8 = local_138;
    uStack_2a0 = uStack_130;
    ::fmt::v8::
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char*&,char*&,char*&>
              (&local_2e8,local_150,local_158,in_stack_00000020,(char **)in_R8);
    local_28 = &local_2b8;
    local_30 = &local_2e8;
    local_18 = 0xccc;
    local_2b8 = 0xccc;
    local_20 = local_30;
    local_10 = local_28;
    local_8 = local_30;
    local_2b0 = local_30;
    ::fmt::v8::detail::locale_ref::locale_ref(&local_2f0);
    args_00.field_1.values_ = in_stack_fffffffffffffcb0.values_;
    args_00.desc_ = in_stack_fffffffffffffca8;
    ::fmt::v8::detail::vformat_to<char>
              (in_stack_fffffffffffffc98,in_stack_fffffffffffffcb8,args_00,in_stack_fffffffffffffca0
              );
    ::fmt::v8::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    s = ::fmt::v8::detail::buffer<char>::data(local_280);
    count = ::fmt::v8::detail::buffer<char>::size(local_280);
    ::fmt::v8::basic_string_view<char>::basic_string_view(local_388,s,count);
    details::log_msg::log_msg
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffc20,in_stack_fffffffffffffc08,
               in_stack_fffffffffffffbec,in_stack_fffffffffffffbf8);
    log_it_(in_stack_fffffffffffffb90,in_stack_00000018,SUB81((ulong)in_stack_00000010 >> 0x38,0),
            SUB81((ulong)in_stack_00000010 >> 0x30,0));
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (in_stack_00000010);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
#ifdef SPDLOG_USE_STD_FORMAT
            memory_buf_t buf = std::vformat(fmt, std::make_format_args(std::forward<Args>(args)...));
#else
            memory_buf_t buf;
            fmt::detail::vformat_to(buf, fmt, fmt::make_format_args(std::forward<Args>(args)...));
#endif
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }